

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O1

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  int iVar1;
  Stats *pSVar2;
  ulong uVar3;
  pointer pIVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  optional<float> *poVar8;
  long *plVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  optional<float> oVar13;
  undefined1 (*pauVar14) [16];
  long lVar15;
  long lVar16;
  ulong uVar17;
  Image *pIVar18;
  long lVar19;
  Float FVar20;
  undefined1 auVar21 [64];
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 (*local_1f8) [16];
  undefined1 local_1e8 [16];
  long *local_1d8 [2];
  long local_1c8 [2];
  long local_1b8;
  ulong local_1b0;
  undefined1 local_1a8 [72];
  ulong uStack_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 uStack_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined1 auStack_120 [8];
  aligned_storage_t<sizeof(pbrt::Bounds2<int>),_alignof(pbrt::Bounds2<int>)> aStack_118;
  ulong uStack_108;
  undefined1 auStack_100 [8];
  optional<int> oStack_f8;
  optional<float> oStack_f0;
  aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
  local_e8;
  ulong uStack_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  _Stack_d8;
  StatsAccumulator *local_a0;
  string local_98;
  string local_78;
  string local_58;
  ulong local_38;
  
  pSVar2 = this->stats;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pixelStatsBaseName_abi_cxx11_,
             DAT_02dd4ac8 + pixelStatsBaseName_abi_cxx11_);
  std::__cxx11::string::append((char *)&local_58);
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_d8._M_impl.super__Rb_tree_header._M_header;
  local_e8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
              )0x0;
  uStack_e0 = 0;
  _Stack_d8._M_impl._0_8_ = 0;
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_128 = 0;
  auStack_120 = (undefined1  [8])0x0;
  aStack_118._0_8_ = 0;
  aStack_118._8_8_ = 0;
  uStack_108 = 0;
  auStack_100 = (undefined1  [8])0x0;
  oStack_f8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  oStack_f8.set = false;
  oStack_f8._5_3_ = 0;
  oStack_f0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  oStack_f0.set = false;
  oStack_f0._5_3_ = 0;
  local_1a8._64_8_ = 0;
  uStack_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  uStack_140 = 0;
  uStack_138 = 0;
  uStack_130 = 0;
  local_1a8._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_1a8[4] = false;
  local_1a8._5_3_ = 0;
  local_1a8._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_1a8[0xc] = false;
  local_1a8._13_3_ = 0;
  local_1a8._16_8_ = 0;
  local_1a8._24_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_1a8[0x1c] = false;
  local_1a8._29_3_ = 0;
  local_1a8._32_8_ = 0;
  local_1a8._40_8_ = 0;
  local_1a8._48_8_ = 0;
  local_1a8._56_8_ = 0;
  _Stack_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar7 = Image::Write(&pSVar2->pixelTime,&local_58,(ImageMetadata *)local_1a8);
  if (!bVar7) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
               ,0x1c1,"Check failed: %s",
               (char (*) [57])"stats->pixelTime.Write(pixelStatsBaseName + \"-time.exr\")");
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ::~_Rb_tree(&_Stack_d8);
  if (uStack_e0._0_1_ == true) {
    uStack_e0 = uStack_e0 & 0xffffffffffffff00;
  }
  if (oStack_f0.set == true) {
    oStack_f0.set = false;
  }
  if (oStack_f8.set == true) {
    oStack_f8.set = false;
  }
  if ((bool)auStack_100[4] == true) {
    auStack_100[4] = 0;
  }
  if (uStack_108._0_1_ == true) {
    uStack_108 = uStack_108 & 0xffffffffffffff00;
  }
  if ((bool)auStack_120[4] == true) {
    auStack_120[4] = 0;
  }
  if (uStack_160._0_1_ == true) {
    uStack_160 = uStack_160 & 0xffffffffffffff00;
  }
  if ((bool)local_1a8[4] == true) {
    local_1a8[4] = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_a0 = this;
  if ((this->stats->pixelCounterImages).
      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      (this->stats->pixelCounterImages).
      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar17 = 0;
    do {
      local_1f8 = &local_1e8;
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d8,pixelStatsBaseName_abi_cxx11_,
                 DAT_02dd4ac8 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_1d8);
      poVar8 = (optional<float> *)
               std::__cxx11::string::_M_append
                         ((char *)local_1d8,
                          (ulong)(this->stats->pixelCounterNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p)
      ;
      oVar13 = (optional<float>)(poVar8 + 2);
      if (*poVar8 == oVar13) {
        local_1a8._16_8_ = *(undefined8 *)oVar13;
        local_1a8._24_8_ = poVar8[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)oVar13;
        local_1a8._0_8_ = *poVar8;
      }
      local_1a8._8_8_ = poVar8[1];
      *poVar8 = oVar13;
      poVar8[1].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      poVar8[1].set = false;
      *(undefined3 *)&poVar8[1].field_0x5 = 0;
      poVar8[2].optionalValue.__data[0] = '\0';
      plVar9 = (long *)std::__cxx11::string::append(local_1a8);
      pauVar14 = (undefined1 (*) [16])(plVar9 + 2);
      if ((undefined1 (*) [16])*plVar9 == pauVar14) {
        local_1e8 = *pauVar14;
      }
      else {
        local_1e8._0_8_ = *(long *)*pauVar14;
        local_1f8 = (undefined1 (*) [16])*plVar9;
      }
      uVar3 = plVar9[1];
      *plVar9 = (long)pauVar14;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (uVar3 != 0) {
        uVar10 = 0;
        do {
          if ((*local_1f8)[uVar10] == '/') {
            (*local_1f8)[uVar10] = 0x5f;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar3);
      }
      pIVar4 = (this->stats->pixelCounterImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b8 = uVar17 * 0x98;
      iVar1 = pIVar4[uVar17].resolution.super_Tuple2<pbrt::Point2,_int>.y;
      bVar7 = iVar1 < 1;
      local_1b0 = uVar17;
      if (0 < iVar1) {
        pIVar18 = pIVar4 + uVar17;
        lVar16 = 0;
        lVar19 = 0;
        do {
          if (0 < (pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            bVar5 = true;
            lVar15 = 0;
            do {
              FVar20 = Image::GetChannel(pIVar18,(Point2i)(lVar16 + lVar15),0,
                                         (WrapMode2D)0x200000002);
              if ((FVar20 != 0.0) || (NAN(FVar20))) {
                if (bVar5) goto LAB_00291314;
                break;
              }
              lVar15 = lVar15 + 1;
              lVar11 = (long)(pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              bVar5 = lVar15 < lVar11;
            } while (lVar15 < lVar11);
          }
          lVar19 = lVar19 + 1;
          lVar15 = (long)(pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          lVar16 = lVar16 + 0x100000000;
          bVar7 = lVar15 <= lVar19;
        } while (lVar19 < lVar15);
      }
LAB_00291314:
      this = local_a0;
      uVar17 = local_1b0;
      if (!bVar7) {
        pIVar4 = (local_a0->stats->pixelCounterImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_78,local_1f8,*local_1f8 + uVar3);
        local_e8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                    )0x0;
        uStack_e0 = 0;
        _Stack_d8._M_impl._0_8_ = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_128 = 0;
        auStack_120 = (undefined1  [8])0x0;
        aStack_118._0_8_ = 0;
        aStack_118._8_8_ = 0;
        uStack_108 = 0;
        auStack_100 = (undefined1  [8])0x0;
        oStack_f8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        oStack_f8.set = false;
        oStack_f8._5_3_ = 0;
        oStack_f0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        oStack_f0.set = false;
        oStack_f0._5_3_ = 0;
        local_1a8._64_8_ = 0;
        uStack_160 = 0;
        uStack_158 = 0;
        uStack_150 = 0;
        uStack_148 = 0;
        uStack_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        local_1a8._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_1a8[4] = false;
        local_1a8._5_3_ = 0;
        local_1a8._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_1a8[0xc] = false;
        local_1a8._13_3_ = 0;
        local_1a8._16_8_ = 0;
        local_1a8._24_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_1a8[0x1c] = false;
        local_1a8._29_3_ = 0;
        local_1a8._32_8_ = 0;
        local_1a8._40_8_ = 0;
        local_1a8._48_8_ = 0;
        local_1a8._56_8_ = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_d8._M_impl.super__Rb_tree_header._M_header;
        _Stack_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar7 = Image::Write((Image *)((long)&pIVar4->format + local_1b8),&local_78,
                             (ImageMetadata *)local_1a8);
        if (!bVar7) {
          LogFatal<char_const(&)[38]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                     ,0x1d1,"Check failed: %s",
                     (char (*) [38])"stats->pixelCounterImages[i].Write(n)");
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_d8);
        if (uStack_e0._0_1_ == true) {
          uStack_e0 = uStack_e0 & 0xffffffffffffff00;
        }
        if (oStack_f0.set == true) {
          oStack_f0.set = false;
        }
        if (oStack_f8.set == true) {
          oStack_f8.set = false;
        }
        if ((bool)auStack_100[4] == true) {
          auStack_100[4] = 0;
        }
        if (uStack_108._0_1_ == true) {
          uStack_108 = uStack_108 & 0xffffffffffffff00;
        }
        if ((bool)auStack_120[4] == true) {
          auStack_120[4] = 0;
        }
        if (uStack_160._0_1_ == true) {
          uStack_160 = uStack_160 & 0xffffffffffffff00;
        }
        if ((bool)local_1a8[4] == true) {
          local_1a8[4] = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8._0_8_ + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)(((long)(this->stats->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->stats->pixelCounterImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  if ((this->stats->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->stats->pixelRatioImages).super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      local_1f8 = &local_1e8;
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1d8,pixelStatsBaseName_abi_cxx11_,
                 DAT_02dd4ac8 + pixelStatsBaseName_abi_cxx11_);
      std::__cxx11::string::append((char *)local_1d8);
      poVar8 = (optional<float> *)
               std::__cxx11::string::_M_append
                         ((char *)local_1d8,
                          (ulong)(this->stats->pixelRatioNames).
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar17]._M_dataplus._M_p)
      ;
      oVar13 = (optional<float>)(poVar8 + 2);
      if (*poVar8 == oVar13) {
        local_1a8._16_8_ = *(undefined8 *)oVar13;
        local_1a8._24_8_ = poVar8[3];
        local_1a8._0_8_ = (long)local_1a8 + 0x10;
      }
      else {
        local_1a8._16_8_ = *(undefined8 *)oVar13;
        local_1a8._0_8_ = *poVar8;
      }
      local_1a8._8_8_ = poVar8[1];
      *poVar8 = oVar13;
      poVar8[1].optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
      poVar8[1].set = false;
      *(undefined3 *)&poVar8[1].field_0x5 = 0;
      poVar8[2].optionalValue.__data[0] = '\0';
      puVar12 = (undefined8 *)std::__cxx11::string::append(local_1a8);
      pauVar14 = (undefined1 (*) [16])(puVar12 + 2);
      if ((undefined1 (*) [16])*puVar12 == pauVar14) {
        local_1e8 = *pauVar14;
      }
      else {
        local_1e8._0_8_ = *(undefined8 *)*pauVar14;
        local_1f8 = (undefined1 (*) [16])*puVar12;
      }
      uVar3 = puVar12[1];
      *puVar12 = pauVar14;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      if (local_1a8._0_8_ != (long)local_1a8 + 0x10) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (uVar3 != 0) {
        uVar10 = 0;
        do {
          if ((*local_1f8)[uVar10] == '/') {
            (*local_1f8)[uVar10] = 0x5f;
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar3);
      }
      pIVar4 = (this->stats->pixelRatioImages).
               super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_1b8 = uVar17 * 0x98;
      iVar1 = pIVar4[uVar17].resolution.super_Tuple2<pbrt::Point2,_int>.y;
      bVar7 = iVar1 < 1;
      local_38 = uVar17;
      if (0 < iVar1) {
        pIVar18 = pIVar4 + uVar17;
        lVar16 = 0;
        bVar7 = false;
        do {
          if (0 < (pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>.x) {
            bVar5 = true;
            lVar19 = 0;
            do {
              Image::GetChannels((ImageChannelValues *)local_1a8,pIVar18,
                                 (Point2i)(lVar19 + (lVar16 << 0x20)),(WrapMode2D)0x200000002);
              oVar13 = (optional<float>)local_1a8._8_8_;
              if ((optional<float>)local_1a8._8_8_ == (optional<float>)0x0) {
                oVar13 = (optional<float>)((long)local_1a8 + 0x10);
              }
              auVar21 = ZEXT464(*(uint *)oVar13);
              if (1 < (ulong)local_1a8._40_8_) {
                uVar17 = 1;
                do {
                  auVar6 = vmaxss_avx(ZEXT416(*(uint *)((long)oVar13 + uVar17 * 4)),auVar21._0_16_);
                  auVar21 = ZEXT1664(auVar6);
                  uVar17 = uVar17 + 1;
                } while (local_1a8._40_8_ != uVar17);
              }
              local_1b0 = CONCAT44(local_1b0._4_4_,auVar21._0_4_);
              InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                        ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                         local_1a8);
              if (((float)local_1b0 != 0.0) || (NAN((float)local_1b0))) {
                if (bVar5) goto LAB_00291753;
                break;
              }
              lVar19 = lVar19 + 1;
              lVar15 = (long)(pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>.x;
              bVar5 = lVar19 < lVar15;
            } while (lVar19 < lVar15);
          }
          lVar16 = lVar16 + 1;
          lVar19 = (long)(pIVar18->resolution).super_Tuple2<pbrt::Point2,_int>.y;
          bVar7 = lVar19 <= lVar16;
        } while (lVar16 < lVar19);
      }
LAB_00291753:
      this = local_a0;
      if (!bVar7) {
        pIVar4 = (local_a0->stats->pixelRatioImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_98,local_1f8,*local_1f8 + uVar3);
        local_e8 = (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                    )0x0;
        uStack_e0 = 0;
        _Stack_d8._M_impl._0_8_ = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_128 = 0;
        auStack_120 = (undefined1  [8])0x0;
        aStack_118._0_8_ = 0;
        aStack_118._8_8_ = 0;
        uStack_108 = 0;
        auStack_100 = (undefined1  [8])0x0;
        oStack_f8.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
        oStack_f8.set = false;
        oStack_f8._5_3_ = 0;
        oStack_f0.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        oStack_f0.set = false;
        oStack_f0._5_3_ = 0;
        local_1a8._64_8_ = 0;
        uStack_160 = 0;
        uStack_158 = 0;
        uStack_150 = 0;
        uStack_148 = 0;
        uStack_140 = 0;
        uStack_138 = 0;
        uStack_130 = 0;
        local_1a8._0_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_1a8[4] = false;
        local_1a8._5_3_ = 0;
        local_1a8._8_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_1a8[0xc] = false;
        local_1a8._13_3_ = 0;
        local_1a8._16_8_ = 0;
        local_1a8._24_4_ = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
        local_1a8[0x1c] = false;
        local_1a8._29_3_ = 0;
        local_1a8._32_8_ = 0;
        local_1a8._40_8_ = 0;
        local_1a8._48_8_ = 0;
        local_1a8._56_8_ = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_d8._M_impl.super__Rb_tree_header._M_header;
        _Stack_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_d8._M_impl.super__Rb_tree_header._M_header._M_left;
        bVar7 = Image::Write((Image *)((long)&pIVar4->format + local_1b8),&local_98,
                             (ImageMetadata *)local_1a8);
        if (!bVar7) {
          LogFatal<char_const(&)[36]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                     ,0x1e2,"Check failed: %s",(char (*) [36])"stats->pixelRatioImages[i].Write(n)")
          ;
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
        ::~_Rb_tree(&_Stack_d8);
        if (uStack_e0._0_1_ == true) {
          uStack_e0 = uStack_e0 & 0xffffffffffffff00;
        }
        if (oStack_f0.set == true) {
          oStack_f0.set = false;
        }
        if (oStack_f8.set == true) {
          oStack_f8.set = false;
        }
        if ((bool)auStack_100[4] == true) {
          auStack_100[4] = 0;
        }
        if (uStack_108._0_1_ == true) {
          uStack_108 = uStack_108 & 0xffffffffffffff00;
        }
        if ((bool)auStack_120[4] == true) {
          auStack_120[4] = 0;
        }
        if (uStack_160._0_1_ == true) {
          uStack_160 = uStack_160 & 0xffffffffffffff00;
        }
        if ((bool)local_1a8[4] == true) {
          local_1a8[4] = 0;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      uVar17 = local_38;
      if (local_1f8 != &local_1e8) {
        operator_delete(local_1f8,local_1e8._0_8_ + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)(((long)(this->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->stats->pixelRatioImages).
                                     super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>.
                                     _M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x79435e50d79435e5));
  }
  return;
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}